

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void jx9_context_release_value(jx9_context *pCtx,jx9_value *pValue)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((pValue != (jx9_value *)0x0) && (uVar2 = (ulong)(pCtx->sVar).nUsed, uVar2 != 0)) {
    pvVar1 = (pCtx->sVar).pBase;
    uVar3 = 0;
    do {
      if (*(jx9_value **)((long)pvVar1 + uVar3 * 8) == pValue) {
        jx9MemObjRelease(pValue);
        SyMemBackendPoolFree(&pCtx->pVm->sAllocator,pValue);
        *(undefined8 *)((long)pvVar1 + uVar3 * 8) = 0;
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

JX9_PRIVATE void jx9VmReleaseContextValue(
	jx9_context *pCtx, /* Call context */
	jx9_value *pValue  /* Release this value */
	)
{
	if( pValue == 0 ){
		/* NULL value is a harmless operation */
		return;
	}
	if( SySetUsed(&pCtx->sVar) > 0 ){
		jx9_value **apObj = (jx9_value **)SySetBasePtr(&pCtx->sVar);
		sxu32 n;
		for( n = 0 ; n < SySetUsed(&pCtx->sVar) ; ++n ){
			if( apObj[n] == pValue ){
				jx9MemObjRelease(pValue);
				SyMemBackendPoolFree(&pCtx->pVm->sAllocator, pValue);
				/* Mark as released */
				apObj[n] = 0;
				break;
			}
		}
	}
}